

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

longdouble * trng::math::detail::Beta<long_double>(longdouble x,longdouble y)

{
  unkuint10 Var1;
  int iVar2;
  int *piVar3;
  longdouble *plVar4;
  longdouble *extraout_RAX;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar5;
  longdouble in_ST2;
  double __x;
  longdouble in_stack_00000008;
  longdouble in_stack_00000018;
  longdouble z;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined8 in_stack_ffffffffffffff52;
  undefined2 uVar8;
  
  if ((Beta<long_double>(long_double,long_double)::ln_max == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Beta<long_double>(long_double,long_double)::ln_max), iVar2 != 0))
  {
    std::numeric_limits<long_double>::max();
    Var1 = (unkuint10)in_ST0 >> 0x40;
    in_ST0 = in_ST2;
    ln((longdouble)CONCAT82(in_stack_ffffffffffffff52,(short)Var1));
    Beta<long_double>::ln_max = in_ST1;
    __cxa_guard_release(&Beta<long_double>(long_double,long_double)::ln_max);
  }
  if ((in_stack_00000008 <= (longdouble)0) || (in_stack_00000018 <= (longdouble)0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x21;
    plVar4 = std::numeric_limits<long_double>::signaling_NaN();
  }
  else {
    lVar5 = in_stack_00000018 + in_stack_00000008;
    uVar6 = (undefined2)((unkuint10)lVar5 >> 0x40);
    ln((longdouble)CONCAT82(in_stack_ffffffffffffff52,uVar6));
    uVar7 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
    uVar8 = (undefined2)((unkuint10)in_stack_00000018 >> 0x40);
    if (lVar5 * in_ST0 - lVar5 <= Beta<long_double>::ln_max) {
      Gamma((longdouble)CONCAT82(in_stack_ffffffffffffff52,uVar7));
      Gamma((longdouble)CONCAT82(in_stack_ffffffffffffff52,uVar6));
      plVar4 = Gamma((longdouble)CONCAT82(in_stack_ffffffffffffff52,uVar8));
    }
    else {
      ln_Gamma((longdouble)CONCAT82(in_stack_ffffffffffffff52,uVar7));
      ln_Gamma((longdouble)CONCAT82(in_stack_ffffffffffffff52,uVar8));
      ln_Gamma((longdouble)CONCAT82(in_stack_ffffffffffffff52,uVar6));
      std::exp(__x);
      plVar4 = extraout_RAX;
    }
  }
  return plVar4;
}

Assistant:

TRNG_CUDA_ENABLE T Beta(T x, T y) {
        static const T ln_max{ln(numeric_limits<T>::max())};
        if (x <= 0 or y <= 0) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::signaling_NaN();
        }
        const T z{x + y};
        if (z * ln(z) - z > ln_max)
          // less accurate but avoids overflow
          return exp(ln_Gamma(x) + ln_Gamma(y) - ln_Gamma(z));
        return Gamma(x) / Gamma(z) * Gamma(y);
      }